

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestApprovals.h
# Opt level: O1

void __thiscall
ApprovalTests::anon_unknown_0::DocTestApprovalListener::test_case_start
          (DocTestApprovalListener *this,TestCaseData *testInfo)

{
  TestName *this_00;
  allocator local_59;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_38;
  
  this_00 = &this->currentTest;
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const*const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &testInfo->m_name);
  if ((testInfo->m_file).field_0.buf[0x17] < '\0') {
    testInfo = (TestCaseData *)(testInfo->m_file).field_0.data.ptr;
  }
  ::std::__cxx11::string::string((string *)&local_38,(char *)testInfo,&local_59);
  TestName::setFileName(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  FrameworkIntegrations::setCurrentTest(this_00);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/doctest/DocTestApprovals.h:115:21)>
             ::_M_invoke;
  local_48 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/doctest/DocTestApprovals.h:115:21)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void test_case_start(const doctest::TestCaseData& testInfo) override
            {
                currentTest.sections.emplace_back(testInfo.m_name);
                currentTest.setFileName(doctestToString(testInfo.m_file));
                ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
                ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                    []() { REQUIRE(true); });
            }